

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

void CESkyCoord::ICRS2Galactic(CESkyCoord *in_icrs,CESkyCoord *out_galactic)

{
  long *in_RSI;
  long *in_RDI;
  CEDate *this;
  double dVar1;
  CEAngle CVar2;
  double glat;
  double glon;
  undefined8 in_stack_fffffffffffffee0;
  CEDateType date_format;
  double in_stack_fffffffffffffee8;
  CEDate *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [64];
  CEAngle local_90 [2];
  undefined1 local_70 [64];
  CEAngle local_30;
  undefined8 local_20;
  undefined8 local_18;
  long *local_10;
  long *local_8;
  
  date_format = (CEDateType)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  local_18 = 0;
  local_20 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,date_format);
  (**(code **)(*in_RDI + 0x18))(&local_30,in_RDI,local_70);
  this = (CEDate *)CEAngle::Rad(&local_30);
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(this,dVar1,(CEDateType)((ulong)local_8 >> 0x20));
  (**(code **)(*local_8 + 0x20))(local_90,local_8,local_d0);
  dVar1 = CEAngle::Rad(local_90);
  iauIcrs2g(this,dVar1,&local_18,&local_20);
  CEAngle::~CEAngle((CEAngle *)0x13ded7);
  CEDate::~CEDate((CEDate *)0x13dee1);
  CEAngle::~CEAngle((CEAngle *)0x13deee);
  CEDate::~CEDate((CEDate *)0x13defb);
  CEAngle::Rad((double *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  CVar2 = CEAngle::Rad((double *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  (**(code **)(*local_10 + 0x28))(CVar2.angle_,local_10,local_e0,local_f0,&stack0xffffffffffffff0c);
  CEAngle::~CEAngle((CEAngle *)0x13df5f);
  CEAngle::~CEAngle((CEAngle *)0x13df69);
  return;
}

Assistant:

void CESkyCoord::ICRS2Galactic(const CESkyCoord& in_icrs,
                               CESkyCoord*       out_galactic)
{
    // Use the sofa method to convert the coordinates
    double glon(0.0);
    double glat(0.0);
    iauIcrs2g(in_icrs.XCoord().Rad(), in_icrs.YCoord().Rad(), &glon, &glat);
    out_galactic->SetCoordinates(CEAngle::Rad(glon), 
                                 CEAngle::Rad(glat),
                                 CESkyCoordType::GALACTIC);

    return;
}